

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

Define * find_define(Context_conflict1 *ctx,char *sym)

{
  IncludeState *pIVar1;
  byte bVar2;
  uint8 uVar3;
  int iVar4;
  uint uVar5;
  size_t __n;
  char *pcVar6;
  char *local_80;
  size_t len_1;
  char *str_1;
  size_t bufsize;
  IncludeState *state_1;
  char *str;
  size_t len;
  char *fname;
  IncludeState *state;
  uint8 linestrhash;
  Define *pDStack_30;
  uint8 filestrhash;
  Define *bucket;
  uint8 hash;
  char *sym_local;
  Context_conflict1 *ctx_local;
  
  bVar2 = hash_define(sym);
  for (pDStack_30 = ctx->define_hashtable[bVar2]; pDStack_30 != (Define *)0x0;
      pDStack_30 = pDStack_30->next) {
    iVar4 = strcmp(pDStack_30->identifier,sym);
    if (iVar4 == 0) {
      return pDStack_30;
    }
  }
  uVar3 = hash_define("__FILE__");
  if (uVar3 != 'C') {
    __assert_fail("hash_define(\"__FILE__\") == filestrhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x1bc,"const Define *find_define(Context *, const char *)");
  }
  uVar3 = hash_define("__LINE__");
  if (uVar3 != 'K') {
    __assert_fail("hash_define(\"__LINE__\") == linestrhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x1bf,"const Define *find_define(Context *, const char *)");
  }
  if (((bVar2 == 0x43) && (ctx->file_macro != (Define *)0x0)) &&
     (iVar4 = strcmp(sym,"__FILE__"), iVar4 == 0)) {
    Free(ctx,ctx->file_macro->definition);
    if (ctx->include_stack == (IncludeState *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = ctx->include_stack->filename;
    }
    __n = strlen(local_80);
    pcVar6 = (char *)Malloc(ctx,__n + 2);
    if (pcVar6 == (char *)0x0) {
      return (Define *)0x0;
    }
    *pcVar6 = '\"';
    memcpy(pcVar6 + 1,local_80,__n);
    pcVar6[__n + 1] = '\"';
    ctx->file_macro->definition = pcVar6;
    return ctx->file_macro;
  }
  if (((bVar2 != 0x4b) || (ctx->line_macro == (Define *)0x0)) ||
     (iVar4 = strcmp(sym,"__LINE__"), iVar4 != 0)) {
    return (Define *)0x0;
  }
  Free(ctx,ctx->line_macro->definition);
  pIVar1 = ctx->include_stack;
  pcVar6 = (char *)Malloc(ctx,0x20);
  if (pcVar6 == (char *)0x0) {
    return (Define *)0x0;
  }
  uVar5 = snprintf(pcVar6,0x20,"%u",(ulong)pIVar1->line);
  if (uVar5 < 0x20) {
    ctx->line_macro->definition = pcVar6;
    return ctx->line_macro;
  }
  __assert_fail("len < bufsize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x1db,"const Define *find_define(Context *, const char *)");
}

Assistant:

static const Define *find_define(Context *ctx, const char *sym)
{
    const uint8 hash = hash_define(sym);
    Define *bucket = ctx->define_hashtable[hash];
    while (bucket)
    {
        if (strcmp(bucket->identifier, sym) == 0)
            return bucket;
        bucket = bucket->next;
    } // while

    const uint8 filestrhash = 67;
    assert(hash_define("__FILE__") == filestrhash);

    const uint8 linestrhash = 75;
    assert(hash_define("__LINE__") == linestrhash);

    if ( (hash == filestrhash) && (ctx->file_macro) && (strcmp(sym, "__FILE__") == 0) )
    {
        Free(ctx, (char *) ctx->file_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const char *fname = state ? state->filename : "";
        const size_t len = strlen(fname) + 2;
        char *str = (char *) Malloc(ctx, len);
        if (!str)
            return NULL;
        str[0] = '\"';
        memcpy(str + 1, fname, len - 2);
        str[len - 1] = '\"';
        ctx->file_macro->definition = str;
        return ctx->file_macro;
    } // if

    else if ( (hash == linestrhash) && (ctx->line_macro) && (strcmp(sym, "__LINE__") == 0) )
    {
        Free(ctx, (char *) ctx->line_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const size_t bufsize = 32;
        char *str = (char *) Malloc(ctx, bufsize);
        if (!str)
            return 0;

        const size_t len = snprintf(str, bufsize, "%u", state->line);
        assert(len < bufsize); (void) len;
        ctx->line_macro->definition = str;
        return ctx->line_macro;
    } // else

    return NULL;
}